

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_fm.hpp
# Opt level: O0

void __thiscall
ymfm::fm_channel<ymfm::opn_registers_base<true>_>::fm_channel
          (fm_channel<ymfm::opn_registers_base<true>_> *this,
          fm_engine_base<ymfm::opn_registers_base<true>_>_conflict *owner,uint32_t choffs)

{
  opn_registers_base<true> *poVar1;
  uint32_t choffs_local;
  fm_engine_base<ymfm::opn_registers_base<true>_>_conflict *owner_local;
  fm_channel<ymfm::opn_registers_base<true>_> *this_local;
  
  this->m_choffs = choffs;
  this->m_feedback[0] = 0;
  this->m_feedback[1] = 0;
  this->m_feedback_in = 0;
  memset(this->m_op,0,0x20);
  this->m_op[0] = (fm_operator<ymfm::opn_registers_base<true>_> *)0x0;
  this->m_op[1] = (fm_operator<ymfm::opn_registers_base<true>_> *)0x0;
  this->m_op[2] = (fm_operator<ymfm::opn_registers_base<true>_> *)0x0;
  this->m_op[3] = (fm_operator<ymfm::opn_registers_base<true>_> *)0x0;
  poVar1 = fm_engine_base<ymfm::opn_registers_base<true>_>::regs
                     ((fm_engine_base<ymfm::opn_registers_base<true>_> *)owner);
  this->m_regs = poVar1;
  this->m_owner = owner;
  this->m_panVolumeL = 0xb504;
  this->m_panVolumeR = 0xb504;
  return;
}

Assistant:

fm_channel<RegisterType>::fm_channel(fm_engine_base<RegisterType> &owner, uint32_t choffs) :
	m_choffs(choffs),
	m_feedback{ 0, 0 },
	m_feedback_in(0),
	m_op{ nullptr, nullptr, nullptr, nullptr },
	m_regs(owner.regs()),
	m_owner(owner),
	m_panVolumeL(46340),
	m_panVolumeR(46340)
{
}